

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O1

void __thiscall TPZFileStream::OpenRead(TPZFileStream *this,string *fileName)

{
  std::ifstream::open((char *)&this->fIn,(_Ios_Openmode)(fileName->_M_dataplus)._M_p);
  return;
}

Assistant:

void TPZFileStream::OpenRead(const std::string &fileName) {
#ifdef PZDEBUG
    if (AmIOpenForRead()) {
        PZError<<"TPZFileStream: File is already opened"<<std::endl;
    }
#endif
    fIn.open(fileName.c_str());
#ifdef PZDEBUG
    if (!AmIOpenForRead()) {
        PZError<<"TPZFileStream: Could not open file"<<std::endl;
    }
#endif
}